

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType *
vectype_from_base(Context_conflict *ctx,MOJOSHADER_astDataType *base,int len)

{
  uint uVar1;
  int iVar2;
  void *value;
  char buf [32];
  void *local_40;
  char local_38 [32];
  
  if (len < 1) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0xa03,
                  "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                 );
  }
  if (4 < len) {
    __assert_fail("len <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0xa04,
                  "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                 );
  }
  if (len != 1) {
    uVar1 = base->type - MOJOSHADER_AST_DATATYPE_BOOL;
    if ((7 < uVar1) || ((0xcfU >> (uVar1 & 0x1f) & 1) == 0)) {
      __assert_fail("0 && \"This shouldn\'t happen\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0xa12,
                    "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                   );
    }
    base = (MOJOSHADER_astDataType *)0x0;
    snprintf(local_38,0x20,"%s%d",&DAT_0015e020 + *(int *)(&DAT_0015e020 + (ulong)uVar1 * 4));
    iVar2 = hash_find((ctx->usertypes).hash,local_38,&local_40);
    if (iVar2 != 0) {
      if (local_40 == (void *)0x0) {
        base = (MOJOSHADER_astDataType *)0x0;
      }
      else {
        base = *(MOJOSHADER_astDataType **)((long)local_40 + 8);
      }
    }
    if (base == (MOJOSHADER_astDataType *)0x0) {
      __assert_fail("datatype != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0xa18,
                    "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                   );
    }
  }
  return base;
}

Assistant:

static const MOJOSHADER_astDataType *vectype_from_base(Context *ctx,
                                            const MOJOSHADER_astDataType *base,
                                            const int len)
{
    assert(len > 0);
    assert(len <= 4);

    if (len == 1)  // return "float" and not "float1"
        return base;

    const char *typestr = NULL;
    switch (base->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL: typestr = "bool"; break;
        case MOJOSHADER_AST_DATATYPE_INT: typestr = "int"; break;
        case MOJOSHADER_AST_DATATYPE_UINT: typestr = "uint"; break;
        case MOJOSHADER_AST_DATATYPE_HALF: typestr = "half"; break;
        case MOJOSHADER_AST_DATATYPE_FLOAT: typestr = "float"; break;
        case MOJOSHADER_AST_DATATYPE_DOUBLE: typestr = "double"; break;
        default: assert(0 && "This shouldn't happen"); break;
    } // switch

    char buf[32];
    snprintf(buf, sizeof (buf), "%s%d", typestr, len);
    const MOJOSHADER_astDataType *datatype = get_usertype(ctx, buf);
    assert(datatype != NULL);
    return datatype;
}